

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O3

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestMembrane::Thing::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined6 in_register_00000032;
  DispatchCallResult DVar3;
  undefined8 uVar2;
  
  lVar1 = *(long *)CONCAT62(in_register_00000032,methodId);
  if ((int)context.hook == 1) {
    (**(code **)(lVar1 + 0x10))(this);
    uVar2 = extraout_RDX_00;
  }
  else {
    if ((int)context.hook != 0) {
      DVar3 = ::capnp::Capability::Server::internalUnimplemented
                        ((Server *)this,
                         (char *)((long)CONCAT62(in_register_00000032,methodId) +
                                 *(long *)(lVar1 + -0x18)),0x2e2e4c,0x3917);
      uVar2 = DVar3._8_8_;
      goto LAB_00216b3d;
    }
    (**(code **)(lVar1 + 8))(this);
    uVar2 = extraout_RDX;
  }
  *(undefined2 *)&this->field_0x8 = 0;
LAB_00216b3d:
  DVar3.isStreaming = (bool)(char)uVar2;
  DVar3.allowCancellation = (bool)(char)((ulong)uVar2 >> 8);
  DVar3._10_6_ = (int6)((ulong)uVar2 >> 0x10);
  DVar3.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar3;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestMembrane::Thing::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        passThrough(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,  ::capnproto_test::capnp::test::TestMembrane::Result>(context)),
        false,
        false
      };
    case 1:
      return {
        intercept(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMembrane::Thing::InterceptParams,  ::capnproto_test::capnp::test::TestMembrane::Result>(context)),
        false,
        false
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestMembrane.Thing",
          0x9352e4e41f173917ull, methodId);
  }
}